

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app-template.c
# Opt level: O1

int load_bootstrapping_info(void)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  size_t lineindex;
  long lVar4;
  undefined8 uStack_140;
  char local_138 [8];
  char buf [255];
  
  uStack_140 = (code *)0x1013a3;
  register0x00000000 = fopen("../devices/tutorial_shared_info-63884.txt","r");
  if (register0x00000000 != (FILE *)0x0) {
    lVar4 = 0;
    while( true ) {
      __s = local_138;
      uStack_140 = (code *)0x1013d7;
      memset(__s,0,0xff);
      uStack_140 = (code *)0x1013e8;
      pcVar1 = fgets(__s,0xff,stack0xffffffffffffffc8);
      if (pcVar1 == (char *)0x0) break;
      if (lVar4 == 0) {
        lVar3 = 0;
        do {
          uStack_140 = (code *)0x101486;
          __isoc99_sscanf(__s,"%2hhx",secp256r1_prv_key_bytes + lVar3);
          __s = __s + 2;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x20);
      }
      else if (lVar4 == 1) {
        uStack_140 = (code *)0x10145b;
        sVar2 = strlen(__s);
        __s[sVar2 - 1] = '\0';
        uStack_140 = (code *)0x101470;
        strcpy(device_identifier,__s);
      }
      else {
        lVar3 = 0;
        if (lVar4 == 2) {
          do {
            uStack_140 = (code *)0x10141d;
            __isoc99_sscanf(__s,"%2hhx",secp256r1_pub_key_bytes + lVar3);
            __s = __s + 2;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x40);
        }
        else {
          do {
            uStack_140 = (code *)0x101444;
            __isoc99_sscanf(__s,"%2hhx",hmac_key_bytes + lVar3);
            __s = __s + 2;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x10);
        }
      }
      lVar4 = lVar4 + 1;
      if (lVar4 == 4) {
        uStack_140 = (code *)0x1014b0;
        fclose(stack0xffffffffffffffc8);
        uStack_140 = (code *)0x1014be;
        printf("Pre-installed ECC Private Key:");
        lVar4 = 0;
        do {
          uStack_140 = (code *)0x1014d7;
          printf("%02X",(ulong)secp256r1_prv_key_bytes[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
        uStack_140 = (code *)0x1014ee;
        printf("\nPre-installed Device Identifier: ");
        uStack_140 = (code *)0x101503;
        printf("%s\nPre-installed ECC Pub Key: ",device_identifier);
        lVar4 = 0;
        do {
          uStack_140 = (code *)0x101523;
          printf("%02X",(ulong)secp256r1_pub_key_bytes[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x40);
        uStack_140 = (code *)0x10153a;
        printf("\nPre-installed Shared Secret: ");
        lVar4 = 0;
        do {
          uStack_140 = (code *)0x10155a;
          printf("%02X",(ulong)hmac_key_bytes[lVar4]);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        uStack_140 = (code *)0x10156d;
        putchar(10);
        return 0;
      }
    }
  }
  uStack_140 = on_temp_content;
  exit(1);
}

Assistant:

int
load_bootstrapping_info()
{
  FILE * fp;
  char* temp_p;     //To receive the return value of fgets
  char buf[255];
  char* buf_ptr;
  fp = fopen("../devices/tutorial_shared_info-63884.txt", "r");
  if (fp == NULL) exit(1);
  size_t i = 0;
  for (size_t lineindex = 0; lineindex < 4; lineindex++) {
    memset(buf, 0, sizeof(buf));
    buf_ptr = buf;
    temp_p = fgets(buf, sizeof(buf), fp);
    if(temp_p == NULL) exit(1);     //Exit if fgets failed
    if (lineindex == 0) {
      for (i = 0; i < 32; i++) {
        sscanf(buf_ptr, "%2hhx", &secp256r1_prv_key_bytes[i]);
        buf_ptr += 2;
      }
    }
    else if (lineindex == 1) {
      buf[strlen(buf) - 1] = '\0';
      strcpy(device_identifier, buf);
    }
    else if (lineindex == 2) {
      for (i = 0; i < 64; i++) {
        sscanf(buf_ptr, "%2hhx", &secp256r1_pub_key_bytes[i]);
        buf_ptr += 2;
      }
    }
    else {
      for (i = 0; i < 16; i++) {
        sscanf(buf_ptr, "%2hhx", &hmac_key_bytes[i]);
        buf_ptr += 2;
      }
    }
  }
  fclose(fp);

  // prv key
  printf("Pre-installed ECC Private Key:");
  for (int i = 0; i < 32; i++) {
    printf("%02X", secp256r1_prv_key_bytes[i]);
  }
  printf("\nPre-installed Device Identifier: ");
  // device id
  printf("%s\nPre-installed ECC Pub Key: ", device_identifier);
  // pub key
  for (int i = 0; i < 64; i++) {
    printf("%02X", secp256r1_pub_key_bytes[i]);
  }
  printf("\nPre-installed Shared Secret: ");
  // hmac key
  for (int i = 0; i < 16; i++) {
    printf("%02X", hmac_key_bytes[i]);
  }
  printf("\n");
  return 0;
}